

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O0

int run_test_getsockname_tcp(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int local_c;
  
  loop = uv_default_loop();
  iVar1 = tcp_listener();
  if (iVar1 == 0) {
    tcp_connector();
    uv_run(loop,UV_RUN_DEFAULT);
    if (getsocknamecount != 3) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
              ,0x150,"getsocknamecount == 3");
      abort();
    }
    if (getpeernamecount != 3) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
              ,0x151,"getpeernamecount == 3");
      abort();
    }
    puVar2 = uv_default_loop();
    close_loop(puVar2);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
              ,0x153,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    local_c = 0;
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

TEST_IMPL(getsockname_tcp) {
  loop = uv_default_loop();

  if (tcp_listener())
    return 1;

  tcp_connector();

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(getsocknamecount == 3);
  ASSERT(getpeernamecount == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}